

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::TileLayerParams::ByteSizeLong(TileLayerParams *this)

{
  int iVar1;
  long lVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  int index;
  
  iVar1 = (this->reps_).current_size_;
  index = 0;
  if (iVar1 < 1) {
    lVar6 = 0;
  }
  else {
    lVar6 = 0;
    do {
      puVar3 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->reps_,index);
      lVar2 = 0x3f;
      if ((*puVar3 | 1) != 0) {
        for (; (*puVar3 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      lVar6 = lVar6 + (ulong)((int)lVar2 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (iVar1 != index);
  }
  uVar5 = (uint)lVar6;
  if (lVar6 == 0) {
    uVar4 = 0;
  }
  else if ((int)uVar5 < 0) {
    uVar4 = 0xb;
  }
  else {
    iVar1 = 0x1f;
    if ((uVar5 | 1) != 0) {
      for (; (uVar5 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    uVar4 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
  }
  this->_reps_cached_byte_size_ = uVar5;
  this->_cached_size_ = (int)(uVar4 + lVar6);
  return uVar4 + lVar6;
}

Assistant:

size_t TileLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.TileLayerParams)
  size_t total_size = 0;

  // repeated uint64 reps = 1;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->reps_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _reps_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}